

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O2

void __thiscall
gimage::Image<float,_gimage::PixelTraits<float>_>::clear
          (Image<float,_gimage::PixelTraits<float>_> *this)

{
  float *pfVar1;
  long lVar2;
  long i;
  long lVar3;
  
  lVar3 = this->n;
  pfVar1 = this->pixel;
  lVar2 = -lVar3;
  if (0 < lVar3) {
    lVar2 = lVar3;
  }
  for (lVar3 = 0; lVar2 != lVar3; lVar3 = lVar3 + 1) {
    pfVar1[lVar3] = INFINITY;
  }
  return;
}

Assistant:

void clear()
    {
      store_t inv=ptraits::limit(ptraits::invalid());

      if (inv == 0)
      {
        memset(pixel, 0, std::abs(n)*sizeof(T));
      }
      else
      {
        long pn=std::abs(n);
        for (long i=0; i<pn; i++)
        {
          pixel[i]=inv;
        }
      }
    }